

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

void __thiscall duckdb::WindowExpression::Serialize(WindowExpression *this,Serializer *serializer)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  ParsedExpression::Serialize(&this->super_ParsedExpression,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"function_name",&this->function_name);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xc9,"schema",&this->schema)
  ;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xca,"catalog",&this->catalog);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xcb,"children",&this->children);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xcc,"partitions",&this->partitions);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (serializer,0xcd,"orders",&this->orders);
  (*serializer->_vptr_Serializer[2])(serializer,0xce,"start");
  Serializer::WriteValue<duckdb::WindowBoundary>(serializer,this->start);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcf,"end");
  Serializer::WriteValue<duckdb::WindowBoundary>(serializer,this->end);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xd0,"start_expr",&this->start_expr);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xd1,"end_expr",&this->end_expr);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xd2,"offset_expr",&this->offset_expr);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xd3,"default_expr",&this->default_expr);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xd4,"ignore_nulls",&this->ignore_nulls);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xd5,"filter_expr",&this->filter_expr);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Serializer::WritePropertyWithDefault<duckdb::WindowExcludeMode>
            (serializer,0xd6,"exclude_clause",&this->exclude_clause,
             (WindowExcludeMode *)((long)&uStack_18 + 7));
  Serializer::WritePropertyWithDefault<bool>(serializer,0xd7,"distinct",&this->distinct);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (serializer,0xd8,"arg_orders",&this->arg_orders);
  return;
}

Assistant:

void WindowExpression::Serialize(Serializer &serializer) const {
	ParsedExpression::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "function_name", function_name);
	serializer.WritePropertyWithDefault<string>(201, "schema", schema);
	serializer.WritePropertyWithDefault<string>(202, "catalog", catalog);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(203, "children", children);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(204, "partitions", partitions);
	serializer.WritePropertyWithDefault<vector<OrderByNode>>(205, "orders", orders);
	serializer.WriteProperty<WindowBoundary>(206, "start", start);
	serializer.WriteProperty<WindowBoundary>(207, "end", end);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(208, "start_expr", start_expr);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(209, "end_expr", end_expr);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(210, "offset_expr", offset_expr);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(211, "default_expr", default_expr);
	serializer.WritePropertyWithDefault<bool>(212, "ignore_nulls", ignore_nulls);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(213, "filter_expr", filter_expr);
	serializer.WritePropertyWithDefault<WindowExcludeMode>(214, "exclude_clause", exclude_clause, WindowExcludeMode::NO_OTHER);
	serializer.WritePropertyWithDefault<bool>(215, "distinct", distinct);
	serializer.WritePropertyWithDefault<vector<OrderByNode>>(216, "arg_orders", arg_orders);
}